

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshrand.c
# Opt level: O0

void random_create(ssh_hashalg *hashalg)

{
  ssh_hashalg *hashalg_local;
  
  if (global_prng == (prng *)0x0) {
    global_prng = prng_new(hashalg);
    prng_seed_begin(global_prng);
    noise_get_heavy(random_seed_callback);
    prng_seed_finish(global_prng);
    next_noise_collection = schedule_timer(300000,random_timer,&random_timer_ctx);
    random_save_seed();
    return;
  }
  __assert_fail("!global_prng",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshrand.c",0x3f,
                "void random_create(const ssh_hashalg *)");
}

Assistant:

static void random_create(const ssh_hashalg *hashalg)
{
    assert(!global_prng);
    global_prng = prng_new(hashalg);

    prng_seed_begin(global_prng);
    noise_get_heavy(random_seed_callback);
    prng_seed_finish(global_prng);

    next_noise_collection =
        schedule_timer(NOISE_REGULAR_INTERVAL, random_timer,
                       &random_timer_ctx);

    /* noise_get_heavy probably read our random seed file.
     * Therefore (in fact, even if it didn't), we should write a
     * fresh one, in case another instance of ourself starts up
     * before we finish, and also in case an attacker gets hold of
     * the seed data we used. */
    random_save_seed();
}